

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

int singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  int iVar1;
  int iVar2;
  BlockCnt *pBVar3;
  ulong uVar4;
  Upvaldesc *pUVar5;
  
  if (fs == (FuncState *)0x0) {
    iVar1 = 0;
  }
  else {
    uVar4 = (ulong)fs->nactvar;
    do {
      if ((int)uVar4 < 1) {
        uVar4 = 0xffffffff;
        break;
      }
      iVar1 = luaS_eqstr(n,fs->f->locvars
                           [(fs->ls->dyd->actvar).arr[(long)fs->firstlocal + uVar4 + -1].idx].
                           varname);
      uVar4 = uVar4 - 1;
    } while (iVar1 == 0);
    iVar2 = (int)uVar4;
    if (iVar2 < 0) {
      iVar1 = -1;
      if (fs->nups != '\0') {
        pUVar5 = fs->f->upvalues;
        uVar4 = 0;
        do {
          iVar2 = luaS_eqstr(pUVar5->name,n);
          if (iVar2 != 0) {
            iVar1 = (int)uVar4;
            break;
          }
          uVar4 = uVar4 + 1;
          pUVar5 = pUVar5 + 1;
        } while (uVar4 < fs->nups);
      }
      if (iVar1 < 0) {
        iVar1 = singlevaraux(fs->prev,n,var,0);
        if (iVar1 == 0) {
          return 0;
        }
        iVar1 = newupvalue(fs,n,var);
      }
      var->t = -1;
      var->f = -1;
      var->k = VUPVAL;
      (var->u).info = iVar1;
      iVar1 = 8;
    }
    else {
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).info = iVar2;
      iVar1 = 7;
      if (base == 0) {
        pBVar3 = (BlockCnt *)&fs->bl;
        do {
          pBVar3 = pBVar3->previous;
        } while (iVar2 < (int)(uint)pBVar3->nactvar);
        pBVar3->upval = '\x01';
      }
    }
  }
  return iVar1;
}

Assistant:

static int singlevaraux (FuncState *fs, TString *n, expdesc *var, int base) {
  if (fs == NULL)  /* no more levels? */
    return VVOID;  /* default is global */
  else {
    int v = searchvar(fs, n);  /* look up locals at current level */
    if (v >= 0) {  /* found? */
      init_exp(var, VLOCAL, v);  /* variable is local */
      if (!base)
        markupval(fs, v);  /* local will be used as an upval */
      return VLOCAL;
    }
    else {  /* not found as local at current level; try upvalues */
      int idx = searchupvalue(fs, n);  /* try existing upvalues */
      if (idx < 0) {  /* not found? */
        if (singlevaraux(fs->prev, n, var, 0) == VVOID) /* try upper levels */
          return VVOID;  /* not found; is a global */
        /* else was LOCAL or UPVAL */
        idx  = newupvalue(fs, n, var);  /* will be a new upvalue */
      }
      init_exp(var, VUPVAL, idx);
      return VUPVAL;
    }
  }
}